

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_get_output_string_op(sexp ctx,sexp self,sexp_sint_t n,sexp out)

{
  sexp_uint_t slen;
  sexp psVar1;
  sexp psVar2;
  sexp_sint_t n_00;
  sexp_sint_t extraout_RDX;
  char *msg;
  sexp_sint_t extraout_RDX_00;
  sexp_sint_t extraout_RDX_01;
  sexp_sint_t sVar3;
  sexp_sint_t extraout_RDX_02;
  sexp ls;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_70;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_68 = (sexp)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_60 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  local_70 = (sexp)&DAT_0000043e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)out & 3) != 0) || (out->tag != 0x11)) {
    psVar2 = sexp_type_exception(ctx,self,0x11,out);
    return psVar2;
  }
  if ((out->value).flonum_bits[0x28] == '\0') {
    msg = "output port is closed";
  }
  else {
    psVar2 = (out->value).type.cpl;
    if ((((ulong)psVar2 & 3) == 0) && (psVar2->tag == 6)) {
      local_58.var = &local_68;
      local_38.next = &local_58;
      local_58.next = (ctx->value).context.saves;
      (ctx->value).context.saves = local_38.next;
      local_38.var = &local_60;
      local_48.next = &local_38;
      (ctx->value).context.saves = local_48.next;
      local_48.var = &local_70;
      (ctx->value).context.saves = &local_48;
      slen = (out->value).port.offset;
      if (slen == 0) {
        local_60 = (((out->value).type.cpl)->value).type.cpl;
        sVar3 = 0;
        psVar2 = self;
      }
      else {
        psVar2 = (out->value).type.setters;
        local_70 = sexp_c_string(ctx,(char *)psVar2,slen);
        local_60 = sexp_cons_op(ctx,psVar2,n_00,local_70,(((out->value).type.cpl)->value).type.cpl);
        sVar3 = extraout_RDX;
      }
      local_70 = sexp_reverse_op(ctx,psVar2,sVar3,local_60);
      psVar2 = (sexp)&DAT_0000003e;
      local_68 = local_70;
      sVar3 = extraout_RDX_00;
      for (; (((ulong)local_70 & 3) == 0 && (local_70->tag == 6));
          local_70 = (local_70->value).type.cpl) {
        psVar1 = (local_70->value).type.name;
        if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 9)) {
          psVar2 = sexp_xtype_exception(ctx,self,"not an output string port",out);
          sVar3 = extraout_RDX_01;
        }
      }
      if (local_70 != (sexp)&DAT_0000023e) {
        psVar2 = sexp_xtype_exception(ctx,self,"not an output string port",out);
        sVar3 = extraout_RDX_02;
      }
      if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x13)) {
        psVar2 = sexp_string_concatenate_op(ctx,(sexp)0x0,sVar3,local_68,(sexp)&DAT_0000003e);
      }
      (ctx->value).context.saves = local_58.next;
      return psVar2;
    }
    msg = "not a string output port";
  }
  psVar2 = sexp_xtype_exception(ctx,self,msg,out);
  return psVar2;
}

Assistant:

sexp sexp_get_output_string_op (sexp ctx, sexp self, sexp_sint_t n, sexp out) {
  sexp res;
  sexp_gc_var3(ls, rev, tmp);
  sexp_assert_type(ctx, sexp_oportp, SEXP_OPORT, out);
  if (!sexp_port_openp(out))
    return sexp_xtype_exception(ctx, self, "output port is closed", out);
  if (!sexp_pairp(sexp_port_cookie(out)))
    return sexp_xtype_exception(ctx, self, "not a string output port", out);
  sexp_gc_preserve3(ctx, ls, rev, tmp);
  if (sexp_port_offset(out) > 0) {
    tmp = sexp_c_string(ctx, sexp_port_buf(out), sexp_port_offset(out));
    rev = sexp_cons(ctx, tmp, sexp_cdr(sexp_port_cookie(out)));
  } else {
    rev = sexp_cdr(sexp_port_cookie(out));
  }
  ls = sexp_reverse(ctx, rev);
  res = SEXP_FALSE;
  for (tmp = ls; sexp_pairp(tmp); tmp = sexp_cdr(tmp))
    if (!sexp_stringp(sexp_car(tmp)))
      res = sexp_xtype_exception(ctx, self, "not an output string port", out);
  if (!sexp_nullp(tmp))
    res = sexp_xtype_exception(ctx, self, "not an output string port", out);
  if (!sexp_exceptionp(res))
    res = sexp_string_concatenate(ctx, ls, SEXP_FALSE);
  sexp_gc_release3(ctx);
  return res;
}